

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_FloodZones(void)

{
  ReverbContainer *pRVar1;
  ulong uVar2;
  uint zonenum;
  long lVar3;
  long lVar4;
  
  if (numsectors < 1) {
    zonenum = 0;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    zonenum = 0;
    do {
      if (*(short *)((long)sectors->Portals + lVar3 + -0x14) == -1) {
        P_FloodZone((sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar3),zonenum);
        zonenum = zonenum + 1;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x268;
    } while (lVar4 < numsectors);
  }
  uVar2 = 0xffffffffffffffff;
  if (-1 < (int)zonenum) {
    uVar2 = (long)(int)zonenum * 8;
  }
  numzones = zonenum;
  zones = (zone_t *)operator_new__(uVar2);
  pRVar1 = S_FindEnvironment(level.DefaultEnvironment);
  if (pRVar1 == (ReverbContainer *)0x0) {
    Printf("Sound environment %d, %d not found\n",(ulong)(uint)(level.DefaultEnvironment >> 8),
           (ulong)(level.DefaultEnvironment & 0xff));
    pRVar1 = DefaultEnvironments[0];
  }
  if (0 < (int)zonenum) {
    uVar2 = 0;
    do {
      zones[uVar2].Environment = pRVar1;
      uVar2 = uVar2 + 1;
    } while (zonenum != uVar2);
  }
  return;
}

Assistant:

void P_FloodZones ()
{
	int z = 0, i;
	ReverbContainer *reverb;

	for (i = 0; i < numsectors; ++i)
	{
		if (sectors[i].ZoneNumber == 0xFFFF)
		{
			P_FloodZone (&sectors[i], z++);
		}
	}
	numzones = z;
	zones = new zone_t[z];
	reverb = S_FindEnvironment(level.DefaultEnvironment);
	if (reverb == NULL)
	{
		Printf("Sound environment %d, %d not found\n", level.DefaultEnvironment >> 8, level.DefaultEnvironment & 255);
		reverb = DefaultEnvironments[0];
	}
	for (i = 0; i < z; ++i)
	{
		zones[i].Environment = reverb;
	}
}